

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorProto::MergeFrom(DescriptorProto *this,DescriptorProto *from)

{
  uint uVar1;
  void *pvVar2;
  Rep *pRVar3;
  string *initial_value;
  string *psVar4;
  LogMessage *pLVar5;
  void **ppvVar6;
  MessageOptions *pMVar7;
  int iVar8;
  LogFinisher local_1b1;
  LogMessage local_1b0;
  LogMessage local_178;
  LogMessage local_140;
  LogMessage local_108;
  LogMessage local_d0;
  LogMessage local_98;
  LogMessage local_60;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_178,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0xf06);
    pLVar5 = internal::LogMessage::operator<<(&local_178,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_1b0,pLVar5);
    internal::LogMessage::~LogMessage(&local_178);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_140,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x619);
    pLVar5 = internal::LogMessage::operator<<(&local_140,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_1b0,pLVar5);
    internal::LogMessage::~LogMessage(&local_140);
  }
  iVar8 = (from->field_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar8 != 0) {
    pRVar3 = (from->field_).super_RepeatedPtrFieldBase.rep_;
    ppvVar6 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->field_).super_RepeatedPtrFieldBase,iVar8);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
              (&(this->field_).super_RepeatedPtrFieldBase,ppvVar6,pRVar3->elements,iVar8,
               ((this->field_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->field_).super_RepeatedPtrFieldBase.current_size_);
    iVar8 = iVar8 + (this->field_).super_RepeatedPtrFieldBase.current_size_;
    (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar8;
    pRVar3 = (this->field_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar8) {
      pRVar3->allocated_size = iVar8;
    }
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
            (&(this->nested_type_).super_RepeatedPtrFieldBase,
             &(from->nested_type_).super_RepeatedPtrFieldBase);
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_108,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x619);
    pLVar5 = internal::LogMessage::operator<<(&local_108,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_1b0,pLVar5);
    internal::LogMessage::~LogMessage(&local_108);
  }
  iVar8 = (from->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar8 != 0) {
    pRVar3 = (from->enum_type_).super_RepeatedPtrFieldBase.rep_;
    ppvVar6 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar8);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
              (&(this->enum_type_).super_RepeatedPtrFieldBase,ppvVar6,pRVar3->elements,iVar8,
               ((this->enum_type_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->enum_type_).super_RepeatedPtrFieldBase.current_size_);
    iVar8 = iVar8 + (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
    (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar8;
    pRVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar8) {
      pRVar3->allocated_size = iVar8;
    }
  }
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x619);
    pLVar5 = internal::LogMessage::operator<<(&local_d0,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_1b0,pLVar5);
    internal::LogMessage::~LogMessage(&local_d0);
  }
  iVar8 = (from->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar8 != 0) {
    pRVar3 = (from->extension_range_).super_RepeatedPtrFieldBase.rep_;
    ppvVar6 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->extension_range_).super_RepeatedPtrFieldBase,iVar8);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
              (&(this->extension_range_).super_RepeatedPtrFieldBase,ppvVar6,pRVar3->elements,iVar8,
               ((this->extension_range_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->extension_range_).super_RepeatedPtrFieldBase.current_size_);
    iVar8 = iVar8 + (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
    (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar8;
    pRVar3 = (this->extension_range_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar8) {
      pRVar3->allocated_size = iVar8;
    }
  }
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x619);
    pLVar5 = internal::LogMessage::operator<<(&local_98,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_1b0,pLVar5);
    internal::LogMessage::~LogMessage(&local_98);
  }
  iVar8 = (from->extension_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar8 != 0) {
    pRVar3 = (from->extension_).super_RepeatedPtrFieldBase.rep_;
    ppvVar6 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->extension_).super_RepeatedPtrFieldBase,iVar8);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
              (&(this->extension_).super_RepeatedPtrFieldBase,ppvVar6,pRVar3->elements,iVar8,
               ((this->extension_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->extension_).super_RepeatedPtrFieldBase.current_size_);
    iVar8 = iVar8 + (this->extension_).super_RepeatedPtrFieldBase.current_size_;
    (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar8;
    pRVar3 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar8) {
      pRVar3->allocated_size = iVar8;
    }
  }
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x619);
    pLVar5 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_1b0,pLVar5);
    internal::LogMessage::~LogMessage(&local_60);
  }
  iVar8 = (from->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar8 != 0) {
    pRVar3 = (from->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
    ppvVar6 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->oneof_decl_).super_RepeatedPtrFieldBase,iVar8);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
              (&(this->oneof_decl_).super_RepeatedPtrFieldBase,ppvVar6,pRVar3->elements,iVar8,
               ((this->oneof_decl_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_);
    iVar8 = iVar8 + (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
    (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = iVar8;
    pRVar3 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar8) {
      pRVar3->allocated_size = iVar8;
    }
  }
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_1b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x619);
    pLVar5 = internal::LogMessage::operator<<(&local_1b0,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=(&local_1b1,pLVar5);
    internal::LogMessage::~LogMessage(&local_1b0);
  }
  iVar8 = (from->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar8 != 0) {
    pRVar3 = (from->reserved_range_).super_RepeatedPtrFieldBase.rep_;
    ppvVar6 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->reserved_range_).super_RepeatedPtrFieldBase,iVar8);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
              (&(this->reserved_range_).super_RepeatedPtrFieldBase,ppvVar6,pRVar3->elements,iVar8,
               ((this->reserved_range_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_);
    iVar8 = iVar8 + (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
    (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar8;
    pRVar3 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar8) {
      pRVar3->allocated_size = iVar8;
    }
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->reserved_name_).super_RepeatedPtrFieldBase,
             &(from->reserved_name_).super_RepeatedPtrFieldBase);
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      initial_value = (from->name_).ptr_;
      psVar4 = (this->name_).ptr_;
      if (psVar4 != initial_value) {
        if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena(&this->name_,initial_value);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar4);
        }
      }
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      if (this->options_ == (MessageOptions *)0x0) {
        pMVar7 = (MessageOptions *)operator_new(0x70);
        MessageOptions::MessageOptions(pMVar7);
        this->options_ = pMVar7;
      }
      pMVar7 = from->options_;
      if (pMVar7 == (MessageOptions *)0x0) {
        pMVar7 = (MessageOptions *)&_MessageOptions_default_instance_;
      }
      MessageOptions::MergeFrom(this->options_,pMVar7);
    }
  }
  return;
}

Assistant:

void DescriptorProto::MergeFrom(const DescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.DescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  field_.MergeFrom(from.field_);
  nested_type_.MergeFrom(from.nested_type_);
  enum_type_.MergeFrom(from.enum_type_);
  extension_range_.MergeFrom(from.extension_range_);
  extension_.MergeFrom(from.extension_);
  oneof_decl_.MergeFrom(from.oneof_decl_);
  reserved_range_.MergeFrom(from.reserved_range_);
  reserved_name_.MergeFrom(from.reserved_name_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 3u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_name();
      name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
    }
    if (cached_has_bits & 0x00000002u) {
      mutable_options()->::google::protobuf::MessageOptions::MergeFrom(from.options());
    }
  }
}